

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralBlockPanelKernel.h
# Opt level: O0

void __thiscall
Eigen::internal::
gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_4,_2,_1,_false,_false>
::operator()(gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_4,_2,_1,_false,_false>
             *this,double *blockA,const_blas_data_mapper<double,_long,_1> *lhs,long depth,long rows,
            long stride,long offset)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  long lVar6;
  double (*from) [2];
  double *pdVar7;
  long lVar8;
  double extraout_XMM0_Qb;
  Packet2d adVar9;
  long local_1a0;
  long k_1;
  double d;
  double c;
  double b;
  double a;
  long w;
  int p_1;
  int p;
  PacketBlock<__attribute__((__vector_size__(2_*_sizeof(double))))_double,_2> kernel;
  long m;
  long k;
  long peeled_k;
  long peeled_mc;
  long remaining_rows;
  long i;
  long lStack_110;
  int pack;
  long count;
  long lStack_100;
  conj_if<false> cj;
  long stride_local;
  long rows_local;
  long depth_local;
  const_blas_data_mapper<double,_long,_1> *lhs_local;
  double *blockA_local;
  gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_4,_2,_1,_false,_false>
  *this_local;
  
  lStack_100 = stride;
  ignore_unused_variable<long>(&stack0xffffffffffffff00);
  ignore_unused_variable<long>(&offset);
  if ((lStack_100 != 0) || (bVar5 = true, offset != 0)) {
    bVar5 = false;
  }
  if (bVar5) {
    lStack_110 = 0;
    i._4_4_ = 4;
    remaining_rows = 0;
    while (0 < i._4_4_) {
      lVar6 = remaining_rows + ((rows - remaining_rows) / (long)i._4_4_) * (long)i._4_4_;
      for (; remaining_rows < lVar6; remaining_rows = i._4_4_ + remaining_rows) {
        m = 0;
        if (1 < i._4_4_) {
          for (; m < depth / 2 << 1; m = m + 2) {
            for (kernel.packet[1][1] = 0.0; (long)kernel.packet[1][1] < (long)i._4_4_;
                kernel.packet[1][1] = (double)((long)kernel.packet[1][1] + 2)) {
              for (w._4_4_ = 0; w._4_4_ < 2; w._4_4_ = w._4_4_ + 1) {
                adVar9 = ploadu<double__vector(2)>
                                   ((lhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_data +
                                    m + (remaining_rows + w._4_4_ + (long)kernel.packet[1][1]) *
                                        (lhs->super_blas_data_mapper<const_double,_long,_1,_0>).
                                        m_stride);
                *(double *)(&p_1 + (long)w._4_4_ * 4) = adVar9[0];
                kernel.packet[w._4_4_][0] = extraout_XMM0_Qb;
              }
              ptranspose((PacketBlock<__attribute__((__vector_size__(2_*_sizeof(double))))_double,_2>
                          *)&p_1);
              for (w._0_4_ = 0; (int)w < 2; w._0_4_ = (int)w + 1) {
                lVar8 = (long)kernel.packet[1][1] + (long)(i._4_4_ * (int)w);
                from = conj_if<false>::pconj<double__vector(2)>
                                 ((conj_if<false> *)((long)&count + 7),
                                  (double (*) [2])(&p_1 + (long)(int)w * 4));
                pstore<double,double__vector(2)>(blockA + lStack_110 + lVar8,from);
              }
            }
            lStack_110 = (i._4_4_ << 1) + lStack_110;
          }
        }
        for (; m < depth; m = m + 1) {
          for (a = 0.0; (long)a < (long)(i._4_4_ + -3); a = (double)((long)a + 4)) {
            pdVar7 = conj_if<false>::operator()
                               ((conj_if<false> *)((long)&count + 7),
                                (lhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_data +
                                m + (remaining_rows + (long)a) *
                                    (lhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_stride
                               );
            dVar1 = *pdVar7;
            pdVar7 = conj_if<false>::operator()
                               ((conj_if<false> *)((long)&count + 7),
                                (lhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_data +
                                m + (remaining_rows + (long)a + 1) *
                                    (lhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_stride
                               );
            dVar2 = *pdVar7;
            pdVar7 = conj_if<false>::operator()
                               ((conj_if<false> *)((long)&count + 7),
                                (lhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_data +
                                m + (remaining_rows + (long)a + 2) *
                                    (lhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_stride
                               );
            dVar3 = *pdVar7;
            pdVar7 = conj_if<false>::operator()
                               ((conj_if<false> *)((long)&count + 7),
                                (lhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_data +
                                m + (remaining_rows + (long)a + 3) *
                                    (lhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_stride
                               );
            dVar4 = *pdVar7;
            blockA[lStack_110] = dVar1;
            blockA[lStack_110 + 1] = dVar2;
            lVar8 = lStack_110 + 3;
            blockA[lStack_110 + 2] = dVar3;
            lStack_110 = lStack_110 + 4;
            blockA[lVar8] = dVar4;
          }
          if (i._4_4_ % 4 != 0) {
            for (; (long)a < (long)i._4_4_; a = (double)((long)a + 1)) {
              pdVar7 = conj_if<false>::operator()
                                 ((conj_if<false> *)((long)&count + 7),
                                  (lhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_data +
                                  m + (remaining_rows + (long)a) *
                                      (lhs->super_blas_data_mapper<const_double,_long,_1,_0>).
                                      m_stride);
              blockA[lStack_110] = *pdVar7;
              lStack_110 = lStack_110 + 1;
            }
          }
        }
      }
      i._4_4_ = i._4_4_ + -2;
      if ((i._4_4_ < 2) && (i._4_4_ != 0)) {
        i._4_4_ = 2;
      }
    }
    for (; remaining_rows < rows; remaining_rows = remaining_rows + 1) {
      for (local_1a0 = 0; local_1a0 < depth; local_1a0 = local_1a0 + 1) {
        pdVar7 = conj_if<false>::operator()
                           ((conj_if<false> *)((long)&count + 7),
                            (lhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_data +
                            local_1a0 +
                            remaining_rows *
                            (lhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_stride);
        blockA[lStack_110] = *pdVar7;
        lStack_110 = lStack_110 + 1;
      }
    }
    return;
  }
  __assert_fail("((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/products/GeneralBlockPanelKernel.h"
                ,0x71c,
                "void Eigen::internal::gemm_pack_lhs<double, long, Eigen::internal::const_blas_data_mapper<double, long, 1>, 4, 2, 1>::operator()(Scalar *, const DataMapper &, Index, Index, Index, Index) [Scalar = double, Index = long, DataMapper = Eigen::internal::const_blas_data_mapper<double, long, 1>, Pack1 = 4, Pack2 = 2, StorageOrder = 1, Conjugate = false, PanelMode = false]"
               );
}

Assistant:

EIGEN_DONT_INLINE void gemm_pack_lhs<Scalar, Index, DataMapper, Pack1, Pack2, RowMajor, Conjugate, PanelMode>
  ::operator()(Scalar* blockA, const DataMapper& lhs, Index depth, Index rows, Index stride, Index offset)
{
  typedef typename packet_traits<Scalar>::type Packet;
  enum { PacketSize = packet_traits<Scalar>::size };

  EIGEN_ASM_COMMENT("EIGEN PRODUCT PACK LHS");
  EIGEN_UNUSED_VARIABLE(stride);
  EIGEN_UNUSED_VARIABLE(offset);
  eigen_assert(((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride));
  conj_if<NumTraits<Scalar>::IsComplex && Conjugate> cj;
  Index count = 0;

//   const Index peeled_mc3 = Pack1>=3*PacketSize ? (rows/(3*PacketSize))*(3*PacketSize) : 0;
//   const Index peeled_mc2 = Pack1>=2*PacketSize ? peeled_mc3+((rows-peeled_mc3)/(2*PacketSize))*(2*PacketSize) : 0;
//   const Index peeled_mc1 = Pack1>=1*PacketSize ? (rows/(1*PacketSize))*(1*PacketSize) : 0;

  int pack = Pack1;
  Index i = 0;
  while(pack>0)
  {
    Index remaining_rows = rows-i;
    Index peeled_mc = i+(remaining_rows/pack)*pack;
    for(; i<peeled_mc; i+=pack)
    {
      if(PanelMode) count += pack * offset;

      const Index peeled_k = (depth/PacketSize)*PacketSize;
      Index k=0;
      if(pack>=PacketSize)
      {
        for(; k<peeled_k; k+=PacketSize)
        {
          for (Index m = 0; m < pack; m += PacketSize)
          {
            PacketBlock<Packet> kernel;
            for (int p = 0; p < PacketSize; ++p) kernel.packet[p] = lhs.loadPacket(i+p+m, k);
            ptranspose(kernel);
            for (int p = 0; p < PacketSize; ++p) pstore(blockA+count+m+(pack)*p, cj.pconj(kernel.packet[p]));
          }
          count += PacketSize*pack;
        }
      }
      for(; k<depth; k++)
      {
        Index w=0;
        for(; w<pack-3; w+=4)
        {
          Scalar a(cj(lhs(i+w+0, k))),
                 b(cj(lhs(i+w+1, k))),
                 c(cj(lhs(i+w+2, k))),
                 d(cj(lhs(i+w+3, k)));
          blockA[count++] = a;
          blockA[count++] = b;
          blockA[count++] = c;
          blockA[count++] = d;
        }
        if(pack%4)
          for(;w<pack;++w)
            blockA[count++] = cj(lhs(i+w, k));
      }

      if(PanelMode) count += pack * (stride-offset-depth);
    }

    pack -= PacketSize;
    if(pack<Pack2 && (pack+PacketSize)!=Pack2)
      pack = Pack2;
  }

  for(; i<rows; i++)
  {
    if(PanelMode) count += offset;
    for(Index k=0; k<depth; k++)
      blockA[count++] = cj(lhs(i, k));
    if(PanelMode) count += (stride-offset-depth);
  }
}